

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_1::LineInterpolationTest::iterate(LineInterpolationTest *this)

{
  pointer pVVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostringstream *poVar3;
  PixelFormat PVar4;
  TestLog *log;
  undefined1 auVar5 [16];
  size_t **ppsVar6;
  LineInterpolationMethod LVar7;
  int iVar8;
  long *plVar9;
  undefined8 *puVar10;
  float *pfVar11;
  int iVar12;
  size_t *psVar13;
  ulong *puVar14;
  size_type *psVar15;
  long lVar16;
  ulong uVar17;
  LineInterpolationTest *pLVar18;
  undefined8 uVar19;
  pointer pVVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  bool bVar24;
  float extraout_XMM0_Da;
  float fVar25;
  undefined4 extraout_XMM0_Da_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Random rnd;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  Surface resultImage;
  string iterationDescription;
  ScopedLogSection section;
  undefined1 local_2a8 [40];
  LineInterpolationTest *local_280;
  string local_278;
  float local_24c;
  undefined1 local_248 [32];
  Surface local_228;
  long lStack_210;
  vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_> local_208;
  string local_1f0;
  ScopedLogSection local_1d0;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  float local_1a8 [6];
  float afStack_190 [14];
  ios_base local_158 [8];
  ios_base local_150 [264];
  RasterizationArguments local_48;
  
  iVar8 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<((ostringstream *)local_1c8,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2a8,0,(char *)0x0,0xadb332);
  ppsVar6 = (size_t **)&local_228.m_pixels.m_cap;
  psVar13 = (size_t *)(plVar9 + 2);
  if ((size_t *)*plVar9 == psVar13) {
    local_228.m_pixels.m_cap = *psVar13;
    lStack_210 = plVar9[3];
    local_228._0_8_ = ppsVar6;
  }
  else {
    local_228.m_pixels.m_cap = *psVar13;
    local_228._0_8_ = (size_t *)*plVar9;
  }
  local_228.m_pixels.m_ptr = (void *)plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_228);
  paVar2 = &local_278.field_2;
  puVar14 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_278.field_2._M_allocated_capacity = *puVar14;
    local_278.field_2._8_8_ = plVar9[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *puVar14;
    local_278._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_278._M_string_length = plVar9[1];
  *plVar9 = (long)puVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  pVVar1 = (pointer)((long)(float *)local_248._8_8_ + local_278._M_string_length);
  uVar19 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    uVar19 = local_278.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar19 < pVVar1) {
    pVVar20 = (pointer)0xf;
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      pVVar20 = (pointer)local_248._16_8_;
    }
    if (pVVar20 < pVVar1) goto LAB_00452ac8;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)local_248,0,(char *)0x0,(ulong)local_278._M_dataplus._M_p);
  }
  else {
LAB_00452ac8:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,local_248._0_8_);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar15 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_1f0.field_2._M_allocated_capacity = *psVar15;
    local_1f0.field_2._8_8_ = puVar10[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar15;
    local_1f0._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_1f0._M_string_length = puVar10[1];
  *puVar10 = psVar15;
  puVar10[1] = 0;
  *(undefined1 *)psVar15 = 0;
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)(float *)local_248._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((size_t **)local_228._0_8_ != ppsVar6) {
    operator_delete((void *)local_228._0_8_,local_228.m_pixels.m_cap + 1);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)(local_2a8 + 0x10)) {
    operator_delete((void *)local_2a8._0_8_,(ulong)((long)(float *)local_2a8._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  iVar8 = this->m_iteration;
  local_280 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  std::ostream::operator<<(local_1c8,iVar8 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base(local_158);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0xadb710);
  pLVar18 = local_280;
  psVar15 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_278.field_2._M_allocated_capacity = *psVar15;
    local_278.field_2._8_8_ = plVar9[3];
    local_278._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_278.field_2._M_allocated_capacity = *psVar15;
    local_278._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_278._M_string_length = plVar9[1];
  *plVar9 = (long)psVar15;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1d0,log,&local_278,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((size_t **)local_228._0_8_ != ppsVar6) {
    operator_delete((void *)local_228._0_8_,local_228.m_pixels.m_cap + 1);
  }
  (*(pLVar18->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [5])(pLVar18);
  iVar8 = (pLVar18->super_BaseRenderingCase).m_renderSize;
  local_24c = extraout_XMM0_Da;
  tcu::Surface::Surface(&local_228,iVar8,iVar8);
  local_2a8._0_8_ = (pointer)0x0;
  local_2a8._8_8_ = (pointer)0x0;
  local_2a8._16_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pLVar18->m_maxLineWidth < local_24c) {
    local_1c8._0_8_ =
         ((pLVar18->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    poVar3 = (ostringstream *)(local_1c8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Line width ",0xb);
    std::ostream::_M_insert<double>((double)local_24c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3," not supported, skipping iteration.",0x23);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_150);
    goto LAB_004535b6;
  }
  local_1c8._0_8_ = (TestLog *)0x3f800000;
  local_1c8._8_8_ = 0x3f80000000000000;
  local_1b8._M_allocated_capacity = 0x3f80000000000000;
  local_1b8._8_8_ = 0x3f80000000000000;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_1a8[2] = 1.0;
  local_1a8[3] = 1.0;
  deRandom_init((deRandom *)&local_278,
                pLVar18->m_iteration * 1000 + *(int *)&(pLVar18->super_BaseRenderingCase).field_0xc4
                + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248,6);
  if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
    lVar21 = 0;
    uVar23 = 0;
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar23;
      fVar25 = deRandom_getFloat((deRandom *)&local_278);
      *(float *)((long)(float *)local_2a8._0_8_ + lVar21) = fVar25 * 1.8 + -0.9;
      fVar25 = deRandom_getFloat((deRandom *)&local_278);
      *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 4) = fVar25 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) = 0;
      fVar25 = 1.0;
      if (pLVar18->m_projective == true) {
        fVar25 = deRandom_getFloat((deRandom *)&local_278);
        fVar25 = fVar25 * 3.8 + 0.2;
        uVar19 = *(undefined8 *)((long)(float *)local_2a8._0_8_ + lVar21);
        *(ulong *)((long)(float *)local_2a8._0_8_ + lVar21) =
             CONCAT44(fVar25 * (float)((ulong)uVar19 >> 0x20),fVar25 * (float)uVar19);
        *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) =
             *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 8) * fVar25;
      }
      *(float *)((long)(float *)local_2a8._0_8_ + lVar21 + 0xc) = fVar25;
      uVar19 = *(undefined8 *)
                ((long)(local_1c8 +
                       lVar21 + (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe
                                ) * -0x18) + 8);
      puVar10 = (undefined8 *)((long)(float *)local_248._0_8_ + lVar21);
      *puVar10 = *(undefined8 *)
                  (local_1c8 +
                  lVar21 + (SUB168(auVar5 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                           -0x18);
      puVar10[1] = uVar19;
      uVar23 = uVar23 + 1;
      lVar21 = lVar21 + 0x10;
    } while ((long)uVar23 < (long)(int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
  }
  iVar8 = *(int *)&(pLVar18->super_BaseRenderingCase).field_0xc4;
  if (iVar8 == 1) {
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
      iVar8 = 0;
      do {
        local_1c8._0_8_ = *(undefined8 *)((pointer)(local_2a8._0_8_ + (long)iVar8 * 0x10))->m_data;
        local_1c8._8_8_ =
             *(undefined8 *)(((pointer)(local_2a8._0_8_ + (long)iVar8 * 0x10))->m_data + 2);
        iVar12 = iVar8 + 1;
        local_1b8._M_allocated_capacity =
             *(undefined8 *)((pointer)(local_2a8._0_8_ + (long)iVar12 * 0x10))->m_data;
        local_1b8._8_8_ =
             *(undefined8 *)(((pointer)(local_2a8._0_8_ + (long)iVar12 * 0x10))->m_data + 2);
        if ((local_280->super_BaseRenderingCase).m_flatshade == true) {
          local_1a8._0_8_ =
               *(undefined8 *)((pointer)(local_248._0_8_ + (long)iVar12 * 0x10))->m_data;
          local_1a8._8_8_ =
               *(undefined8 *)(((pointer)(local_248._0_8_ + (long)iVar12 * 0x10))->m_data + 2);
        }
        else {
          local_1a8._0_8_ = *(undefined8 *)((pointer)(local_248._0_8_ + (long)iVar8 * 0x10))->m_data
          ;
          local_1a8._8_8_ =
               *(undefined8 *)(((pointer)(local_248._0_8_ + (long)iVar8 * 0x10))->m_data + 2);
        }
        local_1a8._16_8_ = *(undefined8 *)((pointer)(local_248._0_8_ + (long)iVar12 * 0x10))->m_data
        ;
        afStack_190._0_8_ =
             *(undefined8 *)(((pointer)(local_248._0_8_ + (long)iVar12 * 0x10))->m_data + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_208,(value_type *)local_1c8);
        iVar8 = iVar8 + 2;
      } while (iVar8 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1);
    }
  }
  else if (iVar8 == 3) {
    if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4) + -1) {
      lVar21 = 0x10;
      lVar22 = 0;
      do {
        puVar10 = (undefined8 *)((long)((pointer)(local_2a8._0_8_ + -0x10))->m_data + lVar21);
        local_1c8._0_8_ = *puVar10;
        local_1c8._8_8_ = puVar10[1];
        lVar22 = lVar22 + 1;
        psVar15 = (size_type *)((long)(float *)local_2a8._0_8_ + lVar21);
        local_1b8._M_allocated_capacity = *psVar15;
        local_1b8._8_8_ = psVar15[1];
        if ((local_280->super_BaseRenderingCase).m_flatshade == true) {
          pfVar11 = (float *)((long)(float *)local_248._0_8_ + lVar21);
          local_1a8._0_8_ = *(undefined8 *)pfVar11;
          local_1a8._8_8_ = *(undefined8 *)(pfVar11 + 2);
          lVar16 = lVar21;
        }
        else {
          pfVar11 = (float *)((long)((pointer)(local_248._0_8_ + -0x10))->m_data + lVar21);
          local_1a8._0_8_ = *(undefined8 *)pfVar11;
          local_1a8._8_8_ = *(undefined8 *)(pfVar11 + 2);
          lVar16 = lVar22 * 0x10;
        }
        pfVar11 = (float *)((long)(float *)local_248._0_8_ + lVar16);
        local_1a8._16_8_ = *(undefined8 *)pfVar11;
        afStack_190._0_8_ = *(undefined8 *)(pfVar11 + 2);
        std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
        push_back(&local_208,(value_type *)local_1c8);
        lVar21 = lVar21 + 0x10;
      } while (lVar22 < (local_2a8._8_8_ - local_2a8._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
    }
  }
  else if ((iVar8 == 2) &&
          (uVar23 = (ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4, 0 < (int)uVar23)) {
    iVar8 = 0;
    do {
      uVar17 = (long)iVar8 % (long)(int)uVar23 & 0xffffffff;
      local_1c8._0_8_ = *(undefined8 *)((pointer)(local_2a8._0_8_ + uVar17 * 0x10))->m_data;
      local_1c8._8_8_ = *(undefined8 *)(((pointer)(local_2a8._0_8_ + uVar17 * 0x10))->m_data + 2);
      iVar8 = iVar8 + 1;
      uVar23 = (long)iVar8 % (long)(int)uVar23 & 0xffffffff;
      local_1b8._M_allocated_capacity =
           *(undefined8 *)((pointer)(local_2a8._0_8_ + uVar23 * 0x10))->m_data;
      local_1b8._8_8_ = *(undefined8 *)(((pointer)(local_2a8._0_8_ + uVar23 * 0x10))->m_data + 2);
      if ((local_280->super_BaseRenderingCase).m_flatshade == true) {
        local_1a8._0_8_ = *(undefined8 *)((pointer)(local_248._0_8_ + uVar23 * 0x10))->m_data;
        local_1a8._8_8_ = *(undefined8 *)(((pointer)(local_248._0_8_ + uVar23 * 0x10))->m_data + 2);
      }
      else {
        local_1a8._0_8_ = *(undefined8 *)((pointer)(local_248._0_8_ + uVar17 * 0x10))->m_data;
        local_1a8._8_8_ = *(undefined8 *)(((pointer)(local_248._0_8_ + uVar17 * 0x10))->m_data + 2);
      }
      local_1a8._16_8_ = *(undefined8 *)((pointer)(local_248._0_8_ + uVar23 * 0x10))->m_data;
      afStack_190._0_8_ = *(undefined8 *)(((pointer)(local_248._0_8_ + uVar23 * 0x10))->m_data + 2);
      std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
      push_back(&local_208,(value_type *)local_1c8);
      uVar23 = (ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4;
    } while (iVar8 < (int)uVar23);
  }
  local_1c8._0_8_ =
       ((local_280->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
       ->m_log;
  poVar3 = (ostringstream *)(local_1c8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_150);
  if (0 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4)) {
    poVar3 = (ostringstream *)(local_1c8 + 8);
    lVar21 = 0;
    lVar22 = 0;
    do {
      local_1c8._0_8_ =
           ((local_280->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
      tcu::operator<<((ostream *)poVar3,
                      (Vector<float,_4> *)((long)(float *)local_2a8._0_8_ + lVar21));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,",\tcolor= ",9);
      tcu::operator<<((ostream *)poVar3,
                      (Vector<float,_4> *)((long)(float *)local_248._0_8_ + lVar21));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_150);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar22 < (int)((ulong)(local_2a8._8_8_ - local_2a8._0_8_) >> 4));
  }
  pLVar18 = local_280;
  BaseRenderingCase::drawPrimitives
            (&local_280->super_BaseRenderingCase,&local_228,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_2a8,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_248,
             *(GLenum *)&(local_280->super_BaseRenderingCase).field_0xc4);
  local_48.numSamples = (pLVar18->super_BaseRenderingCase).m_numSamples;
  local_48.subpixelBits = (pLVar18->super_BaseRenderingCase).m_subpixelBits;
  PVar4 = (pLVar18->super_BaseRenderingCase).m_pixelFormat;
  local_48.redBits = PVar4.redBits;
  local_48.greenBits = PVar4.greenBits;
  local_48.blueBits = (pLVar18->super_BaseRenderingCase).m_pixelFormat.blueBits;
  local_278._M_dataplus._M_p =
       (pointer)local_208.
                super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_278._M_string_length =
       (size_type)
       local_208.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_278.field_2._M_allocated_capacity =
       (size_type)
       local_208.
       super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.
  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(pLVar18->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode
    [5])(pLVar18);
  local_278.field_2._8_4_ = extraout_XMM0_Da_00;
  LVar7 = tcu::verifyLineGroupInterpolation
                    (&local_228,(LineSceneSpec *)&local_278,&local_48,
                     ((pLVar18->super_BaseRenderingCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx)->m_log);
  if (LVar7 == LINEINTERPOLATION_STRICTLY_CORRECT) {
    local_1c8._0_8_ = local_1c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Pass","");
    tcu::ResultCollector::addResult(&pLVar18->m_result,QP_TEST_RESULT_PASS,(string *)local_1c8);
LAB_00453582:
    if ((TestLog *)local_1c8._0_8_ != (TestLog *)(local_1c8 + 0x10)) {
      operator_delete((void *)local_1c8._0_8_,local_1b8._M_allocated_capacity + 1);
    }
  }
  else {
    if (LVar7 == LINEINTERPOLATION_PROJECTED) {
      local_1c8._0_8_ =
           ((pLVar18->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
      poVar3 = (ostringstream *)(local_1c8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar3,
                 "Interpolation was calculated using coordinates projected onto major axis. This method does not produce the same values as the non-projecting method defined in the specification."
                 ,0xb1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar3);
      std::ios_base::~ios_base(local_150);
      local_1c8._0_8_ = local_1c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Interpolation was calculated using projected coordinateds","")
      ;
      tcu::ResultCollector::addResult
                (&pLVar18->m_result,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1c8);
      goto LAB_00453582;
    }
    if (LVar7 == LINEINTERPOLATION_INCORRECT) {
      if ((((float)local_278.field_2._8_4_ == 1.0) && (!NAN((float)local_278.field_2._8_4_))) ||
         ((pLVar18->super_BaseRenderingCase).m_numSamples < 2)) {
        local_1c8._0_8_ = local_1c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Found invalid pixel values","");
        tcu::ResultCollector::addResult(&pLVar18->m_result,QP_TEST_RESULT_FAIL,(string *)local_1c8);
      }
      else {
        local_1c8._0_8_ = local_1c8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1c8,"Interpolation of multisampled wide lines failed","");
        tcu::ResultCollector::addResult
                  (&pLVar18->m_result,QP_TEST_RESULT_COMPATIBILITY_WARNING,(string *)local_1c8);
      }
      goto LAB_00453582;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_278._M_dataplus._M_p,
                    local_278.field_2._M_allocated_capacity - (long)local_278._M_dataplus._M_p);
  }
LAB_004535b6:
  iVar8 = pLVar18->m_iteration + 1;
  pLVar18->m_iteration = iVar8;
  bVar24 = iVar8 != pLVar18->m_iterationCount;
  if (!bVar24) {
    tcu::ResultCollector::setTestContextResult
              (&pLVar18->m_result,
               (pLVar18->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
  }
  if (local_208.
      super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  if ((pointer)local_2a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2a8._0_8_,local_2a8._16_8_ - local_2a8._0_8_);
  }
  tcu::Surface::~Surface(&local_228);
  tcu::TestLog::endSection(local_1d0.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  return (uint)bVar24;
}

Assistant:

LineInterpolationTest::IterateResult LineInterpolationTest::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_testCtx.getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	const float								lineWidth				= getLineWidth();
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;
	std::vector<tcu::Vec4>					colorBuffer;
	std::vector<LineSceneSpec::SceneLine>	lines;

	// supported?
	if (lineWidth <= m_maxLineWidth)
	{
		// generate scene
		generateVertices(m_iteration, drawBuffer, colorBuffer);
		extractLines(lines, drawBuffer, colorBuffer);

		// log
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
			for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
				m_testCtx.getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
		}

		// draw image
		drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitive);

		// compare
		{
			RasterizationArguments	args;
			LineSceneSpec			scene;
			LineInterpolationMethod	iterationResult;

			args.numSamples		= m_numSamples;
			args.subpixelBits	= m_subpixelBits;
			args.redBits		= getPixelFormat().redBits;
			args.greenBits		= getPixelFormat().greenBits;
			args.blueBits		= getPixelFormat().blueBits;

			scene.lines.swap(lines);
			scene.lineWidth = getLineWidth();

			iterationResult = verifyLineGroupInterpolation(resultImage, scene, args, m_testCtx.getLog());
			switch (iterationResult)
			{
				case tcu::LINEINTERPOLATION_STRICTLY_CORRECT:
					// line interpolation matches the specification
					m_result.addResult(QP_TEST_RESULT_PASS, "Pass");
					break;

				case tcu::LINEINTERPOLATION_PROJECTED:
					// line interpolation weights are otherwise correct, but they are projected onto major axis
					m_testCtx.getLog()	<< tcu::TestLog::Message
										<< "Interpolation was calculated using coordinates projected onto major axis. "
										"This method does not produce the same values as the non-projecting method defined in the specification."
										<< tcu::TestLog::EndMessage;
					m_result.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Interpolation was calculated using projected coordinateds");
					break;

				case tcu::LINEINTERPOLATION_INCORRECT:
					if (scene.lineWidth != 1.0f && m_numSamples > 1)
					{
						// multisampled wide lines might not be supported
						m_result.addResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Interpolation of multisampled wide lines failed");
					}
					else
					{
						// line interpolation is incorrect
						m_result.addResult(QP_TEST_RESULT_FAIL, "Found invalid pixel values");
					}
					break;

				default:
					DE_ASSERT(false);
					break;
			}
		}
	}
	else
		m_testCtx.getLog() << tcu::TestLog::Message << "Line width " << lineWidth << " not supported, skipping iteration." << tcu::TestLog::EndMessage;

	// result
	if (++m_iteration == m_iterationCount)
	{
		m_result.setTestContextResult(m_testCtx);
		return STOP;
	}
	else
		return CONTINUE;
}